

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O2

int cgpr_mt(custom_function *funcpt,custom_gradient *funcgrad,double *xc,int N,double *dx,
           double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,double xtol,
           double *xf)

{
  double dVar1;
  int iVar2;
  double *p;
  double *f;
  double *__ptr;
  double *x;
  ulong uVar3;
  uint uVar4;
  size_t __size;
  undefined4 in_register_0000008c;
  ulong uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar7;
  double dVar8;
  double *__x;
  uint N_00;
  double local_e8;
  double alpha;
  double *local_d8;
  double *local_d0;
  double local_c8;
  double local_c0;
  custom_gradient *local_b8;
  double *local_b0;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  double local_90;
  double fxf;
  custom_function *local_80;
  double local_78;
  double local_70;
  double *local_68;
  double *local_60;
  double *local_58;
  double local_50;
  ulong local_48;
  double *local_40;
  int local_34;
  
  fxf = (double)CONCAT44(in_register_0000008c,MAXITER);
  alpha = xtol;
  local_c8 = ftol;
  local_c0 = gtol;
  local_b8 = funcgrad;
  local_80 = funcpt;
  local_70 = eps;
  local_68 = dx;
  local_50 = maxstep;
  local_40 = xc;
  local_60 = (double *)malloc(0x40);
  __size = (long)N << 3;
  local_48 = (ulong)(uint)N;
  p = (double *)malloc(__size);
  f = (double *)malloc(__size);
  __ptr = (double *)malloc(__size);
  x = (double *)malloc(__size);
  *niter = 0;
  if (local_70 < 0.0) {
    local_78 = sqrt(local_70);
  }
  else {
    local_78 = SQRT(local_70);
  }
  local_e8 = 1.0;
  uVar3 = 0;
  iVar2 = (int)local_48;
  uVar5 = 0;
  if (0 < iVar2) {
    uVar5 = local_48 & 0xffffffff;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    x[uVar3] = local_40[uVar3];
  }
  dVar1 = 0.0;
  if (local_50 <= 0.0) {
    __x = (double *)0x0;
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      dVar8 = local_68[uVar3];
      dVar1 = dVar1 + dVar8 * dVar8;
      __x = (double *)((double)__x + dVar8 * x[uVar3] * dVar8 * x[uVar3]);
    }
    if (dVar1 < 0.0) {
      local_40 = __x;
      local_50 = sqrt(dVar1);
      __x = local_40;
    }
    else {
      local_50 = SQRT(dVar1);
    }
    if ((double)__x < 0.0) {
      dVar1 = sqrt((double)__x);
    }
    else {
      dVar1 = SQRT((double)__x);
    }
    iVar2 = (int)local_48;
    if (local_50 <= dVar1) {
      local_50 = dVar1 * 1000.0;
    }
    else {
      local_50 = local_50 * 1000.0;
    }
  }
  iVar2 = grad_fd(local_80,local_b8,x,iVar2,local_68,local_78,f);
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    p[uVar3] = -f[uVar3];
    xf[uVar3] = x[uVar3];
  }
  local_34 = 0;
  if (iVar2 == 0xf) {
    local_34 = 0xf;
  }
  local_90 = (*local_80->funcpt)(x,(int)local_48,local_80->params);
  dVar1 = (double)CONCAT44(local_a8._4_4_,(undefined4)local_a8);
  uVar6 = extraout_XMM0_Dc;
  uVar7 = extraout_XMM0_Dd;
  local_a8 = local_90;
  if (1.79769313486232e+308 <= ABS(local_90)) {
    local_34 = 0xf;
    uStack_a0 = extraout_XMM0_Dc;
    uStack_9c = extraout_XMM0_Dd;
    printf("Program Exiting as the function value exceeds the maximum double value");
    uVar6 = uStack_a0;
    uVar7 = uStack_9c;
    dVar1 = local_a8;
  }
  if (NAN(local_a8)) {
    uStack_a0 = uVar6;
    uStack_9c = uVar7;
    printf("Program Exiting as the function returns NaN");
    local_34 = 0xf;
    uVar6 = uStack_a0;
    uVar7 = uStack_9c;
    dVar1 = local_a8;
  }
  local_d8 = local_60 + 1;
  local_d0 = local_60 + 3;
  local_40 = (double *)0x0;
  iVar2 = local_34;
  local_b0 = x;
  local_58 = __ptr;
  dVar8 = local_a8;
  local_a8 = dVar1;
  do {
    if (iVar2 != 0) {
LAB_00135d13:
      free(local_60);
      free(p);
      free(f);
      free(__ptr);
      free(x);
      return iVar2;
    }
    iVar2 = *niter;
    if (fxf._0_4_ <= iVar2) {
LAB_00135d08:
      iVar2 = (uint)(fxf._0_4_ <= iVar2) << 2;
      goto LAB_00135d13;
    }
    *niter = iVar2 + 1;
    uStack_a0 = uVar6;
    uStack_9c = uVar7;
    local_a8 = dVar8;
    mmult(f,f,local_60,1,(int)local_48,1);
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      __ptr[uVar3] = f[uVar3];
    }
    N_00 = (uint)local_48;
    iVar2 = lnsrchmt(local_80,local_b8,x,&local_90,f,&local_e8,p,N_00,local_68,local_50,SUB84(fxf,0)
                     ,local_78,local_c8,local_c0,alpha,xf);
    if (iVar2 == 100) {
      printf("The Linesearch Algorithm didn\'t converge");
      iVar2 = *niter;
      __ptr = local_58;
      goto LAB_00135d08;
    }
    uVar4 = (int)local_40 + 1;
    local_34 = iVar2;
    mmult(f,f,local_d8,1,N_00,1);
    mmult(local_58,f,local_d0,1,N_00,1);
    __ptr = local_58;
    x = local_b0;
    dVar8 = (local_60[1] - local_60[3]) / *local_60;
    dVar1 = 0.0;
    if (0.0 <= dVar8) {
      dVar1 = dVar8;
    }
    local_60[2] = dVar1;
    if (uVar4 == N_00) {
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        p[uVar3] = -f[uVar3];
      }
      local_40 = (double *)0x0;
    }
    else {
      for (uVar3 = 0; local_40 = (double *)(ulong)uVar4, uVar5 != uVar3; uVar3 = uVar3 + 1) {
        p[uVar3] = p[uVar3] * dVar1 - f[uVar3];
      }
    }
    iVar2 = stopcheck2_mt(local_90,N_00,local_a8,f,local_68,local_70,local_c0,local_c8,local_34);
    uVar6 = 0;
    uVar7 = 0;
    for (uVar3 = 0; dVar8 = local_90, uVar5 != uVar3; uVar3 = uVar3 + 1) {
      x[uVar3] = xf[uVar3];
    }
  } while( true );
}

Assistant:

int cgpr_mt(custom_function *funcpt, custom_gradient *funcgrad, double *xc, int N, double *dx,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf) {
	int i, rcode, retval, k, restart,gfdcode;
	int siter;
	double *xi,*temp, *rk, *pk, *jac, *jacf, *apk;
	double fsval,fxf,eps2,fo;
	double dt1, dt2,alpha;

	temp = (double*)malloc(sizeof(double)* 8);
	rk = (double*)malloc(sizeof(double)*N);
	pk = (double*)malloc(sizeof(double)*N);
	apk = (double*)malloc(sizeof(double)*N);
	jac = (double*)malloc(sizeof(double)*N);
	jacf = (double*)malloc(sizeof(double)*N);
	xi = (double*)malloc(sizeof(double)*N);

	*niter = 0;
	k = 0;
	rcode = 0;
	restart = N;
	siter = MAXITER;
	eps2 = sqrt(eps);
	gfdcode = 0;

	//xtol = 1.0e-15;
	//ftol = 1e-10;
	//gtol = 1e-05;

	// Values that may not be needed

	fsval = 1.0;
	alpha = 1.0;

	for (i = 0; i < N; ++i) {
		xi[i] = xc[i];
	}
	
	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);
		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}



	gfdcode = grad_fd(funcpt,funcgrad, xi, N, dx,eps2, jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	for (i = 0; i < N; ++i) {
		pk[i] = -jac[i];
		xf[i] = xi[i];
	}

	fxf = FUNCPT_EVAL(funcpt,xi, N);

	if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fxf != fxf) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	if (restart < N) {
		restart = N;
	}

	fo = fxf;


	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		k++;

		mmult(jac, jac, temp, 1, N, 1);
		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		retval = lnsrchmt(funcpt,funcgrad, xi,&fxf,jac,&alpha, pk, N, dx, maxstep,MAXITER,eps2, ftol, gtol, xtol, xf);
		if (retval == 100) {
			printf("The Linesearch Algorithm didn't converge");
			break;
		}
		//mdisplay(xf,1,N);
		
		//mdisplay(xf, 1, N);
		//grad_fd(funcpt, xf, N, dx, jacf);
		mmult(jac, jac, temp + 1, 1, N, 1);
		mmult(jacf, jac, temp + 3, 1, N, 1);
		temp[2] = (temp[1] - temp[3]) / temp[0]; // beta

		if (temp[2] < 0) {
			temp[2] = 0;
		}
		if (k == restart) {
			for (i = 0; i < N; ++i) {
				pk[i] = -jac[i];
			}
			k = 0;
		}
		else {
			for (i = 0; i < N; ++i) {
				pk[i] = temp[2] * pk[i] - jac[i];
			}
		}
		

		rcode = stopcheck2_mt(fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		fo = fxf;
		for (i = 0; i < N; ++i) {
			xi[i] = xf[i];
		}
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}

	free(temp);
	free(rk);
	free(pk);
	free(jac);
	free(apk);
	free(jacf);
	free(xi);

	return rcode;
}